

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O3

bool Cipher::loadFreqMap(char *fname,TFreqMap *res,double pmin)

{
  char cVar1;
  _Hash_node_base *p_Var2;
  double dVar3;
  pointer piVar4;
  mapped_type mVar5;
  TFreqMap *pTVar6;
  int iVar7;
  istream *piVar8;
  mapped_type *pmVar9;
  long lVar10;
  long lVar11;
  mapped_type *pmVar12;
  uint uVar13;
  char *pcVar14;
  int iVar15;
  uint uVar16;
  bool bVar17;
  ulong uVar18;
  ulong uVar19;
  __node_base _Var20;
  int iVar21;
  int *mask;
  uint *puVar22;
  mapped_type mVar23;
  vector<int,_std::allocator<int>_> masks;
  int64_t nfreq;
  string gram;
  TCode idx;
  unordered_map<int,_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_long>_>_>
  pi64;
  ifstream fin;
  vector<int,_std::allocator<int>_> local_308;
  mapped_type local_2f0;
  uint local_2e4;
  _Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_2e0;
  double local_2d8;
  TFreqMap *local_2d0;
  char *local_2c8;
  undefined8 local_2c0;
  char local_2b8;
  undefined7 uStack_2b7;
  _Hashtable<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_2a8;
  _Hashtable<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_270;
  long local_238 [4];
  byte abStack_218 [488];
  
  res->len = 0;
  local_2d8 = pmin;
  std::
  _Hashtable<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(res->prob)._M_h);
  printf("[+] Loading n-gram file \'%s\'\n",fname);
  std::ifstream::ifstream(local_238,fname,_S_in);
  if (*(int *)(abStack_218 + *(long *)(local_238[0] + -0x18)) == 0) {
    local_2c8 = &local_2b8;
    local_2c0 = 0;
    local_2b8 = '\0';
    local_2f0 = 0;
    res->nTotal = 0;
    local_270._M_buckets = &local_270._M_single_bucket;
    local_270._M_bucket_count = 1;
    local_270._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_270._M_element_count = 0;
    local_270._M_rehash_policy._M_max_load_factor = 1.0;
    local_270._M_rehash_policy._M_next_resize = 0;
    local_270._M_single_bucket = (__node_base_ptr)0x0;
    local_2e0 = (_Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&res->prob;
    local_2d0 = res;
    while( true ) {
      pTVar6 = local_2d0;
      piVar8 = std::operator>>((istream *)local_238,(string *)&local_2c8);
      std::istream::_M_extract<long>((long *)piVar8);
      if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 2) != 0) break;
      iVar7 = pTVar6->len;
      if (iVar7 == 0) {
        pTVar6->len = (int)local_2c0;
        iVar7 = (int)local_2c0;
      }
      else if (iVar7 != (int)local_2c0) {
        puts("Error: loaded n-grams with vaying lengths");
        goto LAB_00112bc2;
      }
      iVar7 = iVar7 + 1;
      iVar15 = 0;
      pcVar14 = local_2c8;
      do {
        cVar1 = *pcVar14;
        pcVar14 = pcVar14 + 1;
        iVar15 = iVar15 * 0x20 + *(int *)((anonymous_namespace)::kCharToLetter + (long)cVar1 * 4);
        iVar7 = iVar7 + -1;
      } while (1 < iVar7);
      local_2a8._M_buckets = (__buckets_ptr)CONCAT44(local_2a8._M_buckets._4_4_,iVar15);
      pmVar9 = std::__detail::
               _Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_270,(key_type *)&local_2a8);
      mVar5 = local_2f0;
      if (0 < *pmVar9) {
        bVar17 = false;
        printf("Error: duplicate n-gram \'%s\'\n",local_2c8);
        goto LAB_00112bc4;
      }
      pmVar9 = std::__detail::
               _Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_270,(key_type *)&local_2a8);
      *pmVar9 = mVar5;
      local_2d0->nTotal = local_2d0->nTotal + local_2f0;
    }
    printf("    Total n-grams loaded = %g\n",SUB84((double)pTVar6->nTotal,0));
    lVar10 = std::chrono::_V2::steady_clock::now();
    std::vector<int,_std::allocator<int>_>::vector
              (&local_308,(ulong)(uint)~(-1 << ((byte)pTVar6->len & 0x1f)),
               (allocator_type *)&local_2a8);
    if (0 < (int)((ulong)((long)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2)) {
      uVar18 = 0;
      do {
        piVar4 = local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar18] = 0;
        iVar7 = pTVar6->len;
        if (0 < iVar7) {
          uVar13 = 0x1f;
          uVar16 = 0;
          uVar19 = uVar18 & 0xffffffff;
          iVar15 = 0;
          do {
            if ((uVar19 & 1) != 0) {
              uVar16 = uVar16 | uVar13;
              local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar18] = uVar16;
              iVar7 = pTVar6->len;
            }
            uVar19 = uVar19 >> 1;
            uVar13 = uVar13 << 5;
            iVar15 = iVar15 + 1;
          } while (iVar15 < iVar7);
        }
        printf("    Mask %2d: ",uVar18 & 0xffffffff);
        if (0 < pTVar6->len) {
          iVar7 = pTVar6->len * 5;
          iVar21 = 0;
          iVar15 = -1;
          do {
            printf("%d",(ulong)(((uint)piVar4[uVar18] >> (iVar7 + iVar15 & 0x1fU) & 1) != 0));
            iVar21 = iVar21 + 1;
            iVar7 = pTVar6->len * 5;
            iVar15 = iVar15 + -1;
          } while (SBORROW4(iVar21,iVar7) != iVar21 + pTVar6->len * -5 < 0);
        }
        putchar(10);
        uVar18 = uVar18 + 1;
      } while ((long)uVar18 <
               (long)(int)((ulong)((long)local_308.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_308.super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_start) >> 2));
    }
    local_2a8._M_buckets = &local_2a8._M_single_bucket;
    local_2a8._M_bucket_count = 1;
    local_2a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_2a8._M_element_count = 0;
    local_2a8._M_rehash_policy._M_max_load_factor = 1.0;
    local_2a8._M_rehash_policy._M_next_resize = 0;
    local_2a8._M_single_bucket = (__node_base_ptr)0x0;
    if (local_270._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
      uVar18 = 0;
    }
    else {
      _Var20._M_nxt = local_270._M_before_begin._M_nxt;
      do {
        piVar4 = local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        puVar22 = (uint *)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start;
        if (_Var20._M_nxt[2]._M_nxt == (_Hash_node_base *)0x0) {
          printf("i = %d, p == 0 - should not happen\n",(ulong)*(uint *)&_Var20._M_nxt[1]._M_nxt);
          std::
          _Hashtable<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&local_2a8);
          goto LAB_00112bab;
        }
        for (; puVar22 != (uint *)piVar4; puVar22 = puVar22 + 1) {
          p_Var2 = _Var20._M_nxt[2]._M_nxt;
          local_2e4 = *puVar22 & *(uint *)&_Var20._M_nxt[1]._M_nxt;
          pmVar9 = std::__detail::
                   _Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_2a8,(key_type *)&local_2e4);
          *pmVar9 = (long)&p_Var2->_M_nxt + *pmVar9;
        }
        _Var20._M_nxt = (_Var20._M_nxt)->_M_nxt;
      } while (_Var20._M_nxt != (_Hash_node_base *)0x0);
      uVar18 = local_2a8._M_element_count & 0xffffffff;
    }
    printf("Size of pwild = %d\n",uVar18);
    if (local_2a8._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
      _Var20._M_nxt = local_2a8._M_before_begin._M_nxt;
      do {
        p_Var2 = _Var20._M_nxt[2]._M_nxt;
        pmVar9 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_270,(key_type *)(_Var20._M_nxt + 1));
        *pmVar9 = (mapped_type)p_Var2;
        _Var20._M_nxt = (_Var20._M_nxt)->_M_nxt;
      } while (_Var20._M_nxt != (_Hash_node_base *)0x0);
    }
    printf("Size of pi64 = %d\n",local_270._M_element_count & 0xffffffff);
    std::
    _Hashtable<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_2a8);
    local_2a8._M_buckets = (__buckets_ptr)((ulong)local_2a8._M_buckets & 0xffffffff00000000);
    pmVar9 = std::__detail::
             _Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_270,(key_type *)&local_2a8);
    pTVar6 = local_2d0;
    if (*pmVar9 == local_2d0->nTotal) {
      lVar11 = std::chrono::_V2::steady_clock::now();
      printf("    Wildcard probabilities computed in %g ms\n",
             SUB84((double)((lVar11 - lVar10) / 1000000),0));
      if ((uint *)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (uint *)0x0) {
        operator_delete(local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      lVar10 = std::chrono::_V2::steady_clock::now();
      dVar3 = log10(local_2d8);
      pTVar6->pmin = (float)dVar3;
      bVar17 = true;
      printf("    P-min = %g\n",SUB84((double)(float)dVar3,0));
      for (_Var20._M_nxt = local_270._M_before_begin._M_nxt; _Var20._M_nxt != (_Hash_node_base *)0x0
          ; _Var20._M_nxt = (_Var20._M_nxt)->_M_nxt) {
        p_Var2 = _Var20._M_nxt + 1;
        if (_Var20._M_nxt[2]._M_nxt == (_Hash_node_base *)0x0) {
          bVar17 = false;
          printf("i = %d, p == 0 - should not happen\n",(ulong)*(uint *)&p_Var2->_M_nxt);
          goto LAB_00112bc4;
        }
        dVar3 = (double)(long)_Var20._M_nxt[2]._M_nxt / (double)pTVar6->nTotal;
        if (local_2d8 <= dVar3) {
          dVar3 = log10(dVar3);
          pmVar12 = std::__detail::
                    _Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_2e0,(key_type *)p_Var2);
          mVar23 = (mapped_type)dVar3;
        }
        else {
          mVar23 = pTVar6->pmin;
          pmVar12 = std::__detail::
                    _Map_base<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[](local_2e0,(key_type *)p_Var2);
        }
        *pmVar12 = mVar23;
      }
      lVar11 = std::chrono::_V2::steady_clock::now();
      printf("    Probability computation time = %g ms\n",
             SUB84((double)((lVar11 - lVar10) / 1000000),0));
    }
    else {
      local_2a8._M_buckets = (__buckets_ptr)((ulong)local_2a8._M_buckets & 0xffffffff00000000);
      pmVar9 = std::__detail::
               _Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_270,(key_type *)&local_2a8);
      printf("Error: wildcard probability mismatch - p[0] = %ld, expected %ld\n",*pmVar9,
             pTVar6->nTotal);
LAB_00112bab:
      if ((uint *)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (uint *)0x0) {
        operator_delete(local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_308.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
LAB_00112bc2:
      bVar17 = false;
    }
LAB_00112bc4:
    std::
    _Hashtable<int,_std::pair<const_int,_long>,_std::allocator<std::pair<const_int,_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_270);
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,CONCAT71(uStack_2b7,local_2b8) + 1);
    }
  }
  else {
    puts("    Failed to open file");
    bVar17 = false;
  }
  std::ifstream::~ifstream(local_238);
  return bVar17;
}

Assistant:

bool loadFreqMap(const char * fname, TFreqMap & res, double pmin) {
        auto & len = res.len;
        auto & prob = res.prob;

        len = 0;
        prob.clear();

        printf("[+] Loading n-gram file '%s'\n", fname);
        std::ifstream fin(fname);

        if (fin.good() == false) {
            printf("    Failed to open file\n");
            return false;
        }

        std::string gram;
        int64_t nfreq = 0;
        res.nTotal = 0;

        std::unordered_map<TCode, int64_t> pi64;

        while (true) {
            fin >> gram >> nfreq;
            if (fin.eof()) break;

            if (len == 0) {
                len = gram.size();
            } else if (len != (int) gram.size()) {
                printf("Error: loaded n-grams with vaying lengths\n");
                return false;
            }

            TCode idx = calcCode(gram.data(), len);
            if (pi64[idx] > 0) {
                printf("Error: duplicate n-gram '%s'\n", gram.c_str());
                return false;
            }
            pi64[idx] = nfreq;
            res.nTotal += nfreq;
        }
        printf("    Total n-grams loaded = %g\n", (double) res.nTotal);

        // compute wildcard frequencies
        {
            const auto tStart = std::chrono::steady_clock::now();

            std::vector<int32_t> masks((1 << len) - 1);
            for (int m = 0; m < (int) masks.size(); ++m) {
                auto & mask = masks[m];

                mask = 0;
                int32_t l = 0b11111;
                int32_t mm = m;
                for (int i = 0; i < len; ++i) {
                    if (mm & 1) {
                        mask |= l;
                    }
                    mm >>= 1;
                    l <<= 5;
                }

                // print mask in binary
                printf("    Mask %2d: ", m);
                for (int i = 0; i < 5*len; ++i) {
                    printf("%d", (mask >> (5*len - 1 - i)) & 1);
                }
                printf("\n");
            }

            {
                std::unordered_map<TCode, int64_t> pwild;
                for (const auto & [i, p] : pi64) {
                    if (p == 0) {
                        printf("i = %d, p == 0 - should not happen\n", i);
                        return false;
                    }

                    for (const auto & mask : masks) {
                        pwild[i & mask] += p;
                    }
                }

                printf("Size of pwild = %d\n", (int) pwild.size());

                for (auto & [i, p] : pwild) {
                    pi64[i] = p;
                }

                printf("Size of pi64 = %d\n", (int) pi64.size());
            }

            if (pi64[0] != res.nTotal) {
                printf("Error: wildcard probability mismatch - p[0] = %ld, expected %ld\n", (long) pi64[0], (long) res.nTotal);
                return false;
            }

            const auto tEnd = std::chrono::steady_clock::now();
            const auto tDiff = std::chrono::duration_cast<std::chrono::milliseconds>(tEnd - tStart).count();
            printf("    Wildcard probabilities computed in %g ms\n", (double) tDiff);
        }

        // compute probabilities
        {
            const auto tStart = std::chrono::steady_clock::now();

            res.pmin = std::log10(pmin);
            printf("    P-min = %g\n", res.pmin);

            for (auto & [i, p] : pi64) {
                if (p == 0) {
                    printf("i = %d, p == 0 - should not happen\n", i);
                    return false;
                } else {
                    double pp = double(p)/res.nTotal;
                    if (pp < pmin) {
                        prob[i] = res.pmin;
                    } else {
                        prob[i] = std::log10(pp);
                    }
                }
            }

            const auto tEnd = std::chrono::steady_clock::now();
            const auto tDiff = std::chrono::duration_cast<std::chrono::milliseconds>(tEnd - tStart).count();
            printf("    Probability computation time = %g ms\n", (double) tDiff);
        }

        return true;
    }